

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsPublication
helicsFederateRegisterTypePublication
          (HelicsFederate fed,char *key,char *type,char *units,HelicsError *err)

{
  string_view type_00;
  string_view name;
  bool bVar1;
  Publication *pPVar2;
  pointer pPVar3;
  size_t in_RCX;
  char *in_RDX;
  size_t in_RSI;
  unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_> *in_RDI;
  ValueFederate *in_R8;
  __sv_type _Var4;
  string_view in_stack_00000000;
  __single_object pub;
  shared_ptr<helics::ValueFederate> fedObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  HelicsFederate in_stack_ffffffffffffff48;
  __sv_type local_90;
  unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_> *local_80;
  HelicsFederate in_stack_ffffffffffffff90;
  __shared_ptr local_40 [16];
  HelicsPublication local_8;
  
  getValueFedSharedPtr(in_stack_ffffffffffffff48,(HelicsError *)in_stack_ffffffffffffff40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_40);
  if (bVar1) {
    std::make_unique<helics::PublicationObject>();
    std::__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1cb7f5);
    if (in_RSI == 0) {
      _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff90 = (HelicsFederate)_Var4._M_len;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    if (in_RDX == (char *)0x0) {
      _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
      local_80 = (unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                  *)_Var4._M_str;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    if (in_RCX == 0) {
      local_90 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30)
      ;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    name._M_str = (char *)in_RDI;
    name._M_len = in_RSI;
    type_00._M_str = in_RDX;
    type_00._M_len = in_RCX;
    pPVar2 = helics::ValueFederate::registerPublication(in_R8,name,type_00,in_stack_00000000);
    pPVar3 = std::
             unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
             ::operator->((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                           *)0x1cb8db);
    pPVar3->pubPtr = pPVar2;
    std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
    operator->((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                *)0x1cb8ee);
    std::shared_ptr<helics::ValueFederate>::operator=
              ((shared_ptr<helics::ValueFederate> *)local_90._M_str,
               (shared_ptr<helics::ValueFederate> *)local_90._M_len);
    std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
    unique_ptr((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                *)local_90._M_str,
               (unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                *)local_90._M_len);
    local_8 = anon_unknown.dwarf_5d1c2::addPublication(in_stack_ffffffffffffff90,local_80);
    std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
    ~unique_ptr(in_RDI);
    std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
    ~unique_ptr(in_RDI);
  }
  else {
    local_8 = (HelicsPublication)0x0;
  }
  std::shared_ptr<helics::ValueFederate>::~shared_ptr((shared_ptr<helics::ValueFederate> *)0x1cba24)
  ;
  return local_8;
}

Assistant:

HelicsPublication
    helicsFederateRegisterTypePublication(HelicsFederate fed, const char* key, const char* type, const char* units, HelicsError* err)
{
    // now generate a generic input
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto pub = std::make_unique<helics::PublicationObject>();
        pub->pubPtr = &fedObj->registerPublication(AS_STRING_VIEW(key), AS_STRING_VIEW(type), AS_STRING_VIEW(units));
        pub->fedptr = std::move(fedObj);
        return addPublication(fed, std::move(pub));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}